

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O0

uint8_t rcg::anon_unknown_4::rgb2Grey(uint8_t r,uint8_t g,uint8_t b)

{
  uint8_t b_local;
  uint8_t g_local;
  uint8_t r_local;
  
  return (uint8_t)((uint)r * 0x2646 + (uint)g * 0x4b22 + (uint)b * 0xe98 + 0x4000 >> 0xf);
}

Assistant:

inline uint8_t rgb2Grey(uint8_t r, uint8_t g, uint8_t b)
{
  return static_cast<uint8_t>((9798*static_cast<uint32_t>(r)+
                               19234*static_cast<uint32_t>(g)+
                               3736*static_cast<uint32_t>(b)+16384)>>15);
}